

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O1

int ecx_APRD(ecx_portt *port,uint16 ADP,uint16 ADO,uint16 length,void *data,int timeout)

{
  uint8 *puVar1;
  uint uVar2;
  int iVar3;
  undefined6 in_register_0000000a;
  ulong __n;
  uint8 *frameP;
  uint idx;
  
  __n = CONCAT62(in_register_0000000a,length) & 0xffffffff;
  uVar2 = ecx_getindex(port);
  idx = uVar2 & 0xff;
  *(uint16 *)(port->txbuf[idx] + 0xe) = length + 0x100c;
  port->txbuf[idx][0x10] = '\x01';
  port->txbuf[idx][0x11] = (uint8)uVar2;
  *(uint16 *)(port->txbuf[idx] + 0x12) = ADP;
  *(uint16 *)(port->txbuf[idx] + 0x14) = ADO;
  *(short *)(port->txbuf[idx] + 0x16) = (short)__n;
  if ((int)CONCAT62(in_register_0000000a,length) != 0) {
    memcpy(port->txbuf[idx] + 0x1a,data,__n);
  }
  puVar1 = port->txbuf[idx] + __n + 0x1a;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  port->txbuflength[uVar2 & 0xff] = length + 0x1c;
  iVar3 = ecx_srconfirm(port,idx,timeout);
  if (0 < iVar3) {
    memcpy(data,port->rxbuf[idx] + 0xc,__n);
  }
  ecx_setbufstat(port,idx,0);
  return iVar3;
}

Assistant:

int ecx_APRD(ecx_portt *port, uint16 ADP, uint16 ADO, uint16 length, void *data, int timeout)
{
   int wkc;
   uint8 idx;

   idx = ecx_getindex(port);
   ecx_setupdatagram(port, &(port->txbuf[idx]), EC_CMD_APRD, idx, ADP, ADO, length, data);
   wkc = ecx_srconfirm(port, idx, timeout);
   if (wkc > 0)
   {
      memcpy(data, &(port->rxbuf[idx][EC_HEADERSIZE]), length);
   }
   ecx_setbufstat(port, idx, EC_BUF_EMPTY);

   return wkc;
}